

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aloptional.h
# Opt level: O2

void __thiscall
al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~optional(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  if (this->mHasValue == true) {
    std::__cxx11::string::~string((string *)&(this->field_1).mValue);
    return;
  }
  return;
}

Assistant:

~optional() { if(mHasValue) al::destroy_at(std::addressof(mValue)); }